

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.h
# Opt level: O0

bool __thiscall QBitArray::fill(QBitArray *this,bool aval,qsizetype asize)

{
  long in_RDX;
  byte in_SIL;
  long in_FS_OFFSET;
  QBitArray *in_stack_ffffffffffffffa8;
  QBitArray *in_stack_ffffffffffffffb0;
  QBitArray *this_00;
  longlong local_48;
  QBitArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = in_RDX;
  if (in_RDX < 0) {
    local_48 = size(in_stack_ffffffffffffffb0);
  }
  this_00 = &local_20;
  ::QBitArray::QBitArray(this_00,local_48,(bool)(in_SIL & 1));
  operator=(this_00,in_stack_ffffffffffffffa8);
  ~QBitArray((QBitArray *)0x8aa51b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool fill(bool aval, qsizetype asize = -1)
    { *this = QBitArray((asize < 0 ? this->size() : asize), aval); return true; }